

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O3

int __thiscall ktx::OptionsMultiInSingleOut::init(OptionsMultiInSingleOut *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  int iVar2;
  int extraout_EAX;
  OptionAdder *pOVar3;
  undefined1 local_229;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_228;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_160;
  string local_140;
  OptionAdder local_120;
  shared_ptr<const_cxxopts::Value> local_f8;
  shared_ptr<const_cxxopts::Value> local_e8;
  shared_ptr<const_cxxopts::Value> local_d8;
  string local_c8;
  string local_a8;
  string local_88;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  long *local_50 [2];
  long local_40 [2];
  
  local_228 = &local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"");
  uVar1 = local_218._M_allocated_capacity._0_4_;
  local_120.m_group._M_string_length = local_220;
  if (local_228 == &local_218) {
    local_208.field_2._8_4_ = local_218._8_4_;
    local_208.field_2._12_4_ = local_218._12_4_;
    local_228 = &local_208.field_2;
  }
  local_208.field_2._M_allocated_capacity._4_4_ = local_218._M_allocated_capacity._4_4_;
  local_208.field_2._M_allocated_capacity._0_4_ = local_218._M_allocated_capacity._0_4_;
  local_220 = 0;
  local_218._M_allocated_capacity._0_4_ = local_218._M_allocated_capacity._0_4_ & 0xffffff00;
  local_120.m_group._M_dataplus._M_p = (pointer)&local_120.m_group.field_2;
  if (local_228 == &local_208.field_2) {
    local_120.m_group.field_2._M_allocated_capacity =
         CONCAT44(local_218._M_allocated_capacity._4_4_,uVar1);
    local_120.m_group.field_2._8_4_ = local_208.field_2._8_4_;
    local_120.m_group.field_2._12_4_ = local_208.field_2._12_4_;
  }
  else {
    local_120.m_group.field_2._M_allocated_capacity = local_208.field_2._M_allocated_capacity;
    local_120.m_group._M_dataplus._M_p = (pointer)local_228;
  }
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  local_228 = &local_218;
  local_120.m_options = (Options *)ctx;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"stdin","");
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_140,
             "Use stdin as the first input file. (Using a single dash \'-\' as the first input file has the same effect)"
             ,"");
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_1e8,(allocator<cxxopts::values::standard_value<bool>_> *)&local_1a8);
  local_d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_1e8._M_dataplus._M_p._0_4_;
  local_d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_1e8._M_dataplus._M_p._4_4_;
  local_d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_1e8._M_string_length;
  local_d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_1e8._M_string_length._4_4_;
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"");
  pOVar3 = cxxopts::OptionAdder::operator()(&local_120,&local_208,&local_140,&local_d8,&local_160);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"stdout","");
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8,
             "Use stdout as the output file. (Using a single dash \'-\' as the output file has the same effect)"
             ,"");
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_188,(allocator<cxxopts::values::standard_value<bool>_> *)&local_1c8);
  local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_188._M_dataplus._M_p._0_4_;
  local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_188._M_dataplus._M_p._4_4_;
  local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_188._M_string_length;
  local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_188._M_string_length._4_4_;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_1e8,&local_1a8,&local_e8,&local_a8);
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"files","");
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c8,
             "Input/output files. Last file specified will be used as output. Using a single dash \'-\' as an input or output file will use stdin/stdout."
             ,"");
  std::
  __shared_ptr<cxxopts::values::standard_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((__shared_ptr<cxxopts::values::standard_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,(__gnu_cxx::_Lock_policy)2>
              *)&local_68,
             (allocator<cxxopts::values::standard_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&local_229);
  local_f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_68;
  local_f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       uStack_64;
  local_f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = uStack_60;
  local_f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = uStack_5c;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"<filepath>","");
  cxxopts::OptionAdder::operator()(pOVar3,&local_188,&local_1c8,&local_f8,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_f8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_f8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_e8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_e8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_d8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_d8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.m_group._M_dataplus._M_p != &local_120.m_group.field_2) {
    operator_delete(local_120.m_group._M_dataplus._M_p,
                    local_120.m_group.field_2._M_allocated_capacity + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,
                    CONCAT44(local_218._M_allocated_capacity._4_4_,
                             local_218._M_allocated_capacity._0_4_) + 1);
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"files","");
  cxxopts::Options::parse_positional((Options *)ctx,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"<input-file...> <output-file>","");
  iVar2 = std::__cxx11::string::operator=((string *)(ctx + 0x60),(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
    iVar2 = extraout_EAX;
  }
  return iVar2;
}

Assistant:

void init(cxxopts::Options& opts) {
        opts.add_options()
                ("stdin", "Use stdin as the first input file. (Using a single dash '-' as the first input file has the same effect)")
                ("stdout", "Use stdout as the output file. (Using a single dash '-' as the output file has the same effect)")
                ("files", "Input/output files. Last file specified will be used as output."
                          " Using a single dash '-' as an input or output file will use stdin/stdout.", cxxopts::value<std::vector<std::string>>(), "<filepath>");
        opts.parse_positional("files");
        opts.positional_help("<input-file...> <output-file>");
    }